

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O3

void __thiscall notch::io::NetSpec::NetSpec(NetSpec *this,Net *net)

{
  ALossLayer *layer_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar1;
  shared_ptr<const_notch::core::ABackpropLayer> layer;
  LayerSpec spec;
  undefined1 local_a0 [32];
  shared_ptr<notch::core::ABackpropLayer> local_80;
  size_t local_70;
  size_t local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  (this->tag)._M_dataplus._M_p = (pointer)&(this->tag).field_2;
  (this->tag)._M_string_length = 0;
  (this->tag).field_2._M_local_buf[0] = '\0';
  this->inputDim = 0;
  this->outputDim = 0;
  (this->layers).super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->layers).super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->layers).
           super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->layers).
           super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,0x18592a);
  if ((net->layers).
      super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (net->layers).
      super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar1 = 0;
    do {
      core::Net::getLayer((Net *)local_a0,(size_t)net);
      if ((ABackpropLayer *)local_a0._0_8_ != (ABackpropLayer *)0x0) {
        LayerSpec::LayerSpec((LayerSpec *)(local_a0 + 0x10),(ABackpropLayer *)local_a0._0_8_);
        core::std::vector<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>::push_back
                  (&this->layers,(LayerSpec *)(local_a0 + 0x10));
        if (uVar1 == 0) {
          this->inputDim = local_70;
        }
        this->outputDim = local_68;
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
        if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
        }
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
        }
        if ((shared_ptr<notch::core::ABackpropLayer> *)local_a0._16_8_ != &local_80) {
          operator_delete((void *)local_a0._16_8_);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)((long)(net->layers).
                                   super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(net->layers).
                                   super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  layer_00 = (net->lossLayer).
             super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (net->lossLayer).super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (layer_00 != (ALossLayer *)0x0) {
    LayerSpec::LayerSpec((LayerSpec *)(local_a0 + 0x10),layer_00);
    core::std::vector<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>::
    emplace_back<notch::io::LayerSpec>(&this->layers,(LayerSpec *)(local_a0 + 0x10));
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if ((shared_ptr<notch::core::ABackpropLayer> *)local_a0._16_8_ != &local_80) {
      operator_delete((void *)local_a0._16_8_);
    }
    this->hasLoss = true;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    core::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

NetSpec(const Net &net) {
        this->tag = "Net";
        for (size_t i = 0; i < net.size(); ++i) {
            auto layer = net.getLayer(i);
            if (layer) {
                auto spec = LayerSpec(*layer);
                layers.push_back(spec);
                if (i == 0) {
                    inputDim = spec.inputDim;
                }
                outputDim =spec.outputDim;
            }
        }
        auto lossLayer = net.getLossLayer();
        if (lossLayer) {
            layers.push_back(LayerSpec(*lossLayer));
            hasLoss = true;
        }
    }